

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

bool __thiscall
ArmParser::decodeAddressingMode(ArmParser *this,string *text,size_t *pos,uchar *dest)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char c2;
  char c1;
  uchar *dest_local;
  size_t *pos_local;
  string *text_local;
  ArmParser *this_local;
  
  sVar3 = *pos;
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < sVar3 + 2) {
    this_local._7_1_ = false;
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)text);
    cVar1 = *pcVar5;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)text);
    cVar2 = *pcVar5;
    if ((cVar1 == 'i') && (cVar2 == 'b')) {
      *dest = '\0';
    }
    else if ((cVar1 == 'i') && (cVar2 == 'a')) {
      *dest = '\x01';
    }
    else if ((cVar1 == 'd') && (cVar2 == 'b')) {
      *dest = '\x02';
    }
    else if ((cVar1 == 'd') && (cVar2 == 'a')) {
      *dest = '\x03';
    }
    else if ((cVar1 == 'e') && (cVar2 == 'd')) {
      *dest = '\x04';
    }
    else if ((cVar1 == 'f') && (cVar2 == 'd')) {
      *dest = '\x05';
    }
    else if ((cVar1 == 'e') && (cVar2 == 'a')) {
      *dest = '\x06';
    }
    else {
      if ((cVar1 != 'f') || (cVar2 != 'a')) {
        return false;
      }
      *dest = '\a';
    }
    *pos = *pos + 2;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ArmParser::decodeAddressingMode(const std::string& text, size_t& pos, unsigned char& dest)
{
	if (pos+2 > text.size())
		return false;

	char c1 = text[pos+0];
	char c2 = text[pos+1];

	if      (c1 == 'i' && c2 == 'b') dest = ARM_AMODE_IB;
	else if (c1 == 'i' && c2 == 'a') dest = ARM_AMODE_IA;
	else if (c1 == 'd' && c2 == 'b') dest = ARM_AMODE_DB;
	else if (c1 == 'd' && c2 == 'a') dest = ARM_AMODE_DA;
	else if (c1 == 'e' && c2 == 'd') dest = ARM_AMODE_ED;
	else if (c1 == 'f' && c2 == 'd') dest = ARM_AMODE_FD;
	else if (c1 == 'e' && c2 == 'a') dest = ARM_AMODE_EA;
	else if (c1 == 'f' && c2 == 'a') dest = ARM_AMODE_FA;
	else
		return false;

	pos += 2;
	return true;
}